

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_quantize_sse2.c
# Opt level: O1

void aom_quantize_b_adaptive_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  tran_low_t *ptVar1;
  char cVar2;
  bool bVar3;
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  undefined1 auVar30 [14];
  undefined1 auVar31 [14];
  undefined1 auVar32 [14];
  undefined1 auVar33 [14];
  uint uVar34;
  long lVar35;
  uint uVar36;
  uint16_t uVar37;
  short *psVar38;
  ulong uVar39;
  ulong uVar40;
  bool bVar41;
  int iVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  undefined1 in_XMM2 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined8 uVar51;
  ushort uVar57;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ushort uVar58;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  undefined1 auVar59 [16];
  ushort uVar88;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar66 [16];
  undefined1 auVar70 [16];
  undefined1 auVar76 [16];
  short sVar97;
  short sVar98;
  undefined1 auVar89 [16];
  short sVar99;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  ushort uVar100;
  ushort uVar116;
  ushort uVar117;
  ushort uVar118;
  ushort uVar119;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar110 [16];
  short sVar122;
  short sVar123;
  short sVar124;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  short sVar125;
  ushort uVar126;
  ushort uVar129;
  ushort uVar130;
  ushort uVar131;
  ushort uVar132;
  undefined4 uVar133;
  short sVar141;
  short sVar142;
  short sVar143;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar139 [16];
  ushort uVar144;
  ushort uVar146;
  ushort uVar147;
  ushort uVar148;
  ushort uVar149;
  short sVar150;
  short sVar157;
  short sVar158;
  short sVar159;
  short sVar160;
  undefined1 auVar154 [16];
  undefined1 auVar156 [16];
  ushort uVar161;
  undefined1 auVar162 [12];
  ushort uVar166;
  ushort uVar167;
  ushort uVar168;
  short sVar169;
  ushort uVar172;
  short sVar173;
  undefined1 auVar163 [16];
  ushort uVar170;
  ushort uVar171;
  ushort uVar174;
  undefined1 auVar164 [16];
  undefined1 auVar175 [12];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar52 [16];
  ushort uVar55;
  ushort uVar56;
  undefined1 auVar71 [16];
  undefined1 auVar77 [16];
  undefined1 auVar72 [16];
  undefined1 auVar78 [16];
  undefined1 auVar63 [16];
  undefined1 auVar67 [16];
  undefined1 auVar73 [16];
  undefined1 auVar79 [16];
  undefined1 auVar64 [16];
  undefined1 auVar68 [16];
  undefined1 auVar74 [16];
  undefined1 auVar80 [16];
  undefined1 auVar65 [16];
  undefined1 auVar69 [16];
  undefined1 auVar75 [16];
  undefined1 auVar81 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar92 [16];
  undefined1 auVar96 [16];
  undefined1 auVar105 [16];
  undefined1 auVar111 [16];
  undefined1 auVar106 [16];
  undefined1 auVar112 [16];
  undefined1 auVar107 [16];
  undefined1 auVar113 [16];
  undefined1 auVar108 [16];
  undefined1 auVar114 [16];
  undefined1 auVar109 [16];
  undefined1 auVar115 [16];
  undefined8 uVar127;
  undefined1 auVar128 [16];
  undefined6 uVar134;
  undefined1 auVar135 [12];
  undefined1 auVar138 [16];
  short sVar140;
  undefined1 auVar145 [16];
  undefined4 uVar151;
  undefined6 uVar152;
  undefined1 auVar153 [12];
  undefined1 auVar155 [16];
  undefined1 auVar165 [16];
  undefined1 auVar178 [16];
  
  auVar49 = pshuflw(in_XMM2,ZEXT416(*(uint *)dequant_ptr),0xd4);
  auVar50 = pmaddwd(auVar49,_DAT_0051dd50);
  auVar49 = pshuflw(ZEXT416(*(uint *)zbin_ptr),ZEXT416(*(uint *)zbin_ptr),0x60);
  iVar42 = (auVar49._4_4_ >> 0x10) * 0x20 + -1 + (auVar50._4_4_ + 0x40 >> 7);
  sVar44 = zbin_ptr[4] + -1;
  sVar45 = zbin_ptr[5] + -1;
  sVar46 = zbin_ptr[6] + -1;
  sVar47 = zbin_ptr[7] + -1;
  auVar89 = packssdw(*(undefined1 (*) [16])coeff_ptr,*(undefined1 (*) [16])(coeff_ptr + 4));
  auVar120 = packssdw(*(undefined1 (*) [16])(coeff_ptr + 8),*(undefined1 (*) [16])(coeff_ptr + 0xc))
  ;
  sVar150 = auVar89._0_2_;
  sVar169 = -sVar150;
  sVar157 = auVar89._2_2_;
  sVar43 = -sVar157;
  sVar158 = auVar89._4_2_;
  sVar48 = -sVar158;
  sVar159 = auVar89._6_2_;
  sVar173 = -sVar159;
  sVar160 = auVar89._8_2_;
  sVar140 = -sVar160;
  sVar97 = auVar89._10_2_;
  sVar141 = -sVar97;
  sVar98 = auVar89._12_2_;
  sVar142 = -sVar98;
  sVar99 = auVar89._14_2_;
  sVar143 = -sVar99;
  uVar100 = (ushort)(sVar169 < sVar150) * sVar150 | (ushort)(sVar169 >= sVar150) * sVar169;
  uVar116 = (ushort)(sVar43 < sVar157) * sVar157 | (ushort)(sVar43 >= sVar157) * sVar43;
  uVar117 = (ushort)(sVar48 < sVar158) * sVar158 | (ushort)(sVar48 >= sVar158) * sVar48;
  uVar118 = (ushort)(sVar173 < sVar159) * sVar159 | (ushort)(sVar173 >= sVar159) * sVar173;
  uVar51 = CONCAT26(uVar118,CONCAT24(uVar117,CONCAT22(uVar116,uVar100)));
  uVar119 = (ushort)(sVar140 < sVar160) * sVar160 | (ushort)(sVar140 >= sVar160) * sVar140;
  auVar101._0_10_ = CONCAT28(uVar119,uVar51);
  auVar101._10_2_ = (ushort)(sVar141 < sVar97) * sVar97 | (ushort)(sVar141 >= sVar97) * sVar141;
  auVar101._12_2_ = (ushort)(sVar142 < sVar98) * sVar98 | (ushort)(sVar142 >= sVar98) * sVar142;
  auVar101._14_2_ = (ushort)(sVar143 < sVar99) * sVar99 | (ushort)(sVar143 >= sVar99) * sVar143;
  sVar150 = auVar120._0_2_;
  sVar169 = -sVar150;
  sVar157 = auVar120._2_2_;
  sVar43 = -sVar157;
  sVar158 = auVar120._4_2_;
  sVar48 = -sVar158;
  sVar159 = auVar120._6_2_;
  sVar173 = -sVar159;
  sVar160 = auVar120._8_2_;
  sVar140 = -sVar160;
  sVar97 = auVar120._10_2_;
  sVar141 = -sVar97;
  sVar98 = auVar120._12_2_;
  sVar142 = -sVar98;
  sVar99 = auVar120._14_2_;
  sVar143 = -sVar99;
  uVar126 = (ushort)(sVar169 < sVar150) * sVar150 | (ushort)(sVar169 >= sVar150) * sVar169;
  uVar129 = (ushort)(sVar43 < sVar157) * sVar157 | (ushort)(sVar43 >= sVar157) * sVar43;
  uVar130 = (ushort)(sVar48 < sVar158) * sVar158 | (ushort)(sVar48 >= sVar158) * sVar48;
  uVar131 = (ushort)(sVar173 < sVar159) * sVar159 | (ushort)(sVar173 >= sVar159) * sVar173;
  uVar127 = CONCAT26(uVar131,CONCAT24(uVar130,CONCAT22(uVar129,uVar126)));
  uVar132 = (ushort)(sVar140 < sVar160) * sVar160 | (ushort)(sVar140 >= sVar160) * sVar140;
  auVar128._0_10_ = CONCAT28(uVar132,uVar127);
  auVar128._10_2_ = (ushort)(sVar141 < sVar97) * sVar97 | (ushort)(sVar141 >= sVar97) * sVar141;
  auVar128._12_2_ = (ushort)(sVar142 < sVar98) * sVar98 | (ushort)(sVar142 >= sVar98) * sVar142;
  auVar128._14_2_ = (ushort)(sVar143 < sVar99) * sVar99 | (ushort)(sVar143 >= sVar99) * sVar143;
  auVar7._10_2_ = 0;
  auVar7._0_10_ = auVar101._0_10_;
  auVar7._12_2_ = uVar118;
  auVar11._8_2_ = uVar117;
  auVar11._0_8_ = uVar51;
  auVar11._10_4_ = auVar7._10_4_;
  auVar30._6_8_ = 0;
  auVar30._0_6_ = auVar11._8_6_;
  auVar15._4_2_ = uVar116;
  auVar15._0_4_ = CONCAT22(uVar116,uVar100);
  auVar15._6_8_ = SUB148(auVar30 << 0x40,6);
  auVar4._10_2_ = 0;
  auVar4._0_10_ = auVar128._0_10_;
  auVar4._12_2_ = uVar131;
  auVar8._8_2_ = uVar130;
  auVar8._0_8_ = uVar127;
  auVar8._10_4_ = auVar4._10_4_;
  auVar31._6_8_ = 0;
  auVar31._0_6_ = auVar8._8_6_;
  auVar12._4_2_ = uVar129;
  auVar12._0_4_ = CONCAT22(uVar129,uVar126);
  auVar12._6_8_ = SUB148(auVar31 << 0x40,6);
  auVar49._0_4_ =
       -(uint)((auVar49._0_4_ >> 0x10) * 0x20 + -1 + (auVar50._0_4_ + 0x40 >> 7) <
              (int)((uint)uVar100 << 5));
  auVar49._4_4_ = -(uint)(iVar42 < auVar15._4_4_ << 5);
  auVar49._8_4_ = -(uint)(iVar42 < auVar11._8_4_ << 5);
  auVar49._12_4_ = -(uint)(iVar42 < (int)((auVar7._10_4_ >> 0x10) << 5));
  auVar50._0_4_ = -(uint)(iVar42 < (int)((uint)uVar119 << 5));
  auVar50._4_4_ = -(uint)(iVar42 < (int)((uint)auVar101._10_2_ << 5));
  auVar50._8_4_ = -(uint)(iVar42 < (int)((uint)auVar101._12_2_ << 5));
  auVar50._12_4_ = -(uint)(iVar42 < (int)((uint)auVar101._14_2_ << 5));
  auVar50 = packssdw(auVar49,auVar50);
  auVar59._0_4_ = -(uint)(iVar42 < (int)((uint)uVar126 << 5));
  auVar59._4_4_ = -(uint)(iVar42 < auVar12._4_4_ << 5);
  auVar59._8_4_ = -(uint)(iVar42 < auVar8._8_4_ << 5);
  auVar59._12_4_ = -(uint)(iVar42 < (int)((auVar4._10_4_ >> 0x10) << 5));
  auVar136._0_4_ = -(uint)(iVar42 < (int)((uint)uVar132 << 5));
  auVar136._4_4_ = -(uint)(iVar42 < (int)((uint)auVar128._10_2_ << 5));
  auVar136._8_4_ = -(uint)(iVar42 < (int)((uint)auVar128._12_2_ << 5));
  auVar136._12_4_ = -(uint)(iVar42 < (int)((uint)auVar128._14_2_ << 5));
  auVar59 = packssdw(auVar59,auVar136);
  auVar49 = auVar59 | auVar50;
  uVar58 = 0;
  uVar82 = 0;
  uVar83 = 0;
  uVar84 = 0;
  uVar85 = 0;
  uVar86 = 0;
  uVar87 = 0;
  uVar88 = 0;
  bVar28 = (auVar49 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar29 = (auVar49 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar27 = (auVar49 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar26 = (auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar25 = (auVar49 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar24 = (auVar49 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar23 = (auVar49 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar22 = (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar21 = (auVar49 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar20 = (auVar49 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar19 = (auVar49 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar18 = (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar17 = (auVar49 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar16 = (auVar49 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar3 = (auVar49 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar41 = auVar49[0xf] < '\0';
  if (((((((((((((((bVar28 || bVar29) || bVar27) || bVar26) || bVar25) || bVar24) || bVar23) ||
             bVar22) || bVar21) || bVar20) || bVar19) || bVar18) || bVar17) || bVar16) || bVar3) ||
      bVar41) {
    auVar50 = auVar50 & *(undefined1 (*) [16])iscan;
    auVar59 = auVar59 & *(undefined1 (*) [16])(iscan + 8);
    sVar169 = auVar50._0_2_;
    sVar43 = auVar59._0_2_;
    uVar58 = (ushort)(sVar43 < sVar169) * sVar169 | (ushort)(sVar43 >= sVar169) * sVar43;
    sVar169 = auVar50._2_2_;
    sVar43 = auVar59._2_2_;
    uVar82 = (ushort)(sVar43 < sVar169) * sVar169 | (ushort)(sVar43 >= sVar169) * sVar43;
    sVar169 = auVar50._4_2_;
    sVar43 = auVar59._4_2_;
    uVar83 = (ushort)(sVar43 < sVar169) * sVar169 | (ushort)(sVar43 >= sVar169) * sVar43;
    sVar169 = auVar50._6_2_;
    sVar43 = auVar59._6_2_;
    uVar84 = (ushort)(sVar43 < sVar169) * sVar169 | (ushort)(sVar43 >= sVar169) * sVar43;
    sVar169 = auVar50._8_2_;
    sVar43 = auVar59._8_2_;
    uVar85 = (ushort)(sVar43 < sVar169) * sVar169 | (ushort)(sVar43 >= sVar169) * sVar43;
    sVar169 = auVar50._10_2_;
    sVar43 = auVar59._10_2_;
    uVar86 = (ushort)(sVar43 < sVar169) * sVar169 | (ushort)(sVar43 >= sVar169) * sVar43;
    sVar169 = auVar50._12_2_;
    sVar43 = auVar59._12_2_;
    sVar48 = auVar59._14_2_;
    uVar87 = (ushort)(sVar43 < sVar169) * sVar169 | (ushort)(sVar43 >= sVar169) * sVar43;
    sVar169 = auVar50._14_2_;
    uVar88 = (ushort)(sVar48 < sVar169) * sVar169 | (ushort)(sVar48 >= sVar169) * sVar48;
  }
  bVar41 = ((((((((((((((bVar28 || bVar29) || bVar27) || bVar26) || bVar25) || bVar24) || bVar23) ||
                  bVar22) || bVar21) || bVar20) || bVar19) || bVar18) || bVar17) || bVar16) || bVar3
           ) || bVar41;
  auVar154._0_2_ = -(ushort)((short)(*zbin_ptr + -1) < (short)uVar100);
  auVar154._2_2_ = -(ushort)((short)(zbin_ptr[1] + -1) < (short)uVar116);
  auVar154._4_2_ = -(ushort)((short)(zbin_ptr[2] + -1) < (short)uVar117);
  auVar154._6_2_ = -(ushort)((short)(zbin_ptr[3] + -1) < (short)uVar118);
  auVar154._8_2_ = -(ushort)(sVar44 < (short)uVar119);
  auVar154._10_2_ = -(ushort)(sVar45 < (short)auVar101._10_2_);
  auVar154._12_2_ = -(ushort)(sVar46 < (short)auVar101._12_2_);
  auVar154._14_2_ = -(ushort)(sVar47 < (short)auVar101._14_2_);
  auVar137._0_2_ = -(ushort)(sVar44 < (short)uVar126);
  auVar137._2_2_ = -(ushort)(sVar45 < (short)uVar129);
  auVar137._4_2_ = -(ushort)(sVar46 < (short)uVar130);
  auVar137._6_2_ = -(ushort)(sVar47 < (short)uVar131);
  auVar137._8_2_ = -(ushort)(sVar44 < (short)uVar132);
  auVar137._10_2_ = -(ushort)(sVar45 < (short)auVar128._10_2_);
  auVar137._12_2_ = -(ushort)(sVar46 < (short)auVar128._12_2_);
  auVar137._14_2_ = -(ushort)(sVar47 < (short)auVar128._14_2_);
  auVar49 = auVar137 | auVar154;
  cVar2 = auVar49[0xf];
  uVar130 = 0;
  uVar129 = 0;
  uVar126 = 0;
  uVar119 = 0;
  uVar118 = 0;
  uVar117 = 0;
  uVar116 = 0;
  uVar100 = 0;
  bVar28 = (auVar49 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar29 = (auVar49 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar27 = (auVar49 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar26 = (auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar25 = (auVar49 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar24 = (auVar49 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar23 = (auVar49 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar22 = (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar21 = (auVar49 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar20 = (auVar49 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar19 = (auVar49 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar18 = (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar17 = (auVar49 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar16 = (auVar49 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar3 = (auVar49 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  if (((((((((((((((bVar28 || bVar29) || bVar27) || bVar26) || bVar25) || bVar24) || bVar23) ||
             bVar22) || bVar21) || bVar20) || bVar19) || bVar18) || bVar17) || bVar16) || bVar3) ||
      cVar2 < '\0') {
    auVar59 = *(undefined1 (*) [16])iscan & auVar154;
    auVar50 = *(undefined1 (*) [16])(iscan + 8) & auVar137;
    sVar169 = auVar59._0_2_;
    sVar43 = auVar50._0_2_;
    uVar130 = (ushort)(sVar43 < sVar169) * sVar169 | (ushort)(sVar43 >= sVar169) * sVar43;
    sVar169 = auVar59._2_2_;
    sVar43 = auVar50._2_2_;
    uVar129 = (ushort)(sVar43 < sVar169) * sVar169 | (ushort)(sVar43 >= sVar169) * sVar43;
    sVar169 = auVar59._4_2_;
    sVar43 = auVar50._4_2_;
    uVar126 = (ushort)(sVar43 < sVar169) * sVar169 | (ushort)(sVar43 >= sVar169) * sVar43;
    sVar169 = auVar59._6_2_;
    sVar43 = auVar50._6_2_;
    uVar119 = (ushort)(sVar43 < sVar169) * sVar169 | (ushort)(sVar43 >= sVar169) * sVar43;
    sVar169 = auVar59._8_2_;
    sVar43 = auVar50._8_2_;
    uVar118 = (ushort)(sVar43 < sVar169) * sVar169 | (ushort)(sVar43 >= sVar169) * sVar43;
    sVar169 = auVar59._10_2_;
    sVar43 = auVar50._10_2_;
    uVar117 = (ushort)(sVar43 < sVar169) * sVar169 | (ushort)(sVar43 >= sVar169) * sVar43;
    sVar169 = auVar59._12_2_;
    sVar43 = auVar50._12_2_;
    sVar48 = auVar50._14_2_;
    uVar116 = (ushort)(sVar43 < sVar169) * sVar169 | (ushort)(sVar43 >= sVar169) * sVar43;
    sVar169 = auVar59._14_2_;
    uVar100 = (ushort)(sVar48 < sVar169) * sVar169 | (ushort)(sVar48 >= sVar169) * sVar48;
  }
  bVar3 = ((((((((((((((bVar28 || bVar29) || bVar27) || bVar26) || bVar25) || bVar24) || bVar23) ||
                 bVar22) || bVar21) || bVar20) || bVar19) || bVar18) || bVar17) || bVar16) || bVar3)
          || cVar2 < '\0';
  auVar50 = *(undefined1 (*) [16])round_ptr;
  auVar59 = *(undefined1 (*) [16])quant_ptr;
  auVar136 = *(undefined1 (*) [16])dequant_ptr;
  auVar92 = *(undefined1 (*) [16])quant_shift_ptr;
  local_58._8_4_ = auVar59._8_4_;
  local_58._12_4_ = auVar59._12_4_;
  local_68._8_4_ = auVar92._8_4_;
  local_68._12_4_ = auVar92._12_4_;
  local_48._0_8_ = auVar50._8_8_;
  local_58._0_8_ = auVar59._8_8_;
  local_68._0_8_ = auVar92._8_8_;
  sVar48 = auVar136._12_2_;
  sVar173 = auVar136._14_2_;
  sVar169 = auVar136._8_2_;
  sVar43 = auVar136._10_2_;
  if ((((((((((((((((auVar49 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar49 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar49 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar49 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar49 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar49 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar49 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar49 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar49 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar49 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar49 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar49 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar49 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar49 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar49 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < cVar2) {
    *(undefined1 (*) [16])(qcoeff_ptr + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = (undefined1  [16])0x0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    local_48._8_4_ = auVar50._8_4_;
    local_48._12_4_ = auVar50._12_4_;
    *(undefined1 (*) [16])(dqcoeff_ptr + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + 4) = (undefined1  [16])0x0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
  }
  else {
    auVar90 = psraw(auVar89,0xf);
    auVar121 = psraw(auVar120,0xf);
    auVar101 = paddsw(auVar101,auVar50);
    auVar49 = pmulhw(auVar101,auVar59);
    auVar89._0_2_ = auVar49._0_2_ + auVar101._0_2_;
    auVar89._2_2_ = auVar49._2_2_ + auVar101._2_2_;
    auVar89._4_2_ = auVar49._4_2_ + auVar101._4_2_;
    auVar89._6_2_ = auVar49._6_2_ + auVar101._6_2_;
    auVar89._8_2_ = auVar49._8_2_ + auVar101._8_2_;
    auVar89._10_2_ = auVar49._10_2_ + auVar101._10_2_;
    auVar89._12_2_ = auVar49._12_2_ + auVar101._12_2_;
    auVar89._14_2_ = auVar49._14_2_ + auVar101._14_2_;
    auVar49 = pmulhw(auVar89,auVar92);
    local_48._8_4_ = auVar50._8_4_;
    local_48._12_4_ = auVar50._12_4_;
    auVar59 = paddsw(auVar128,local_48);
    auVar50 = pmulhw(auVar59,local_58);
    auVar102._0_2_ = auVar50._0_2_ + auVar59._0_2_;
    auVar102._2_2_ = auVar50._2_2_ + auVar59._2_2_;
    auVar102._4_2_ = auVar50._4_2_ + auVar59._4_2_;
    auVar102._6_2_ = auVar50._6_2_ + auVar59._6_2_;
    auVar102._8_2_ = auVar50._8_2_ + auVar59._8_2_;
    auVar102._10_2_ = auVar50._10_2_ + auVar59._10_2_;
    auVar102._12_2_ = auVar50._12_2_ + auVar59._12_2_;
    auVar102._14_2_ = auVar50._14_2_ + auVar59._14_2_;
    auVar50 = pmulhw(auVar102,local_68);
    auVar49 = auVar49 ^ auVar90;
    auVar120._0_2_ = auVar49._0_2_ - auVar90._0_2_;
    auVar120._2_2_ = auVar49._2_2_ - auVar90._2_2_;
    auVar120._4_2_ = auVar49._4_2_ - auVar90._4_2_;
    auVar120._6_2_ = auVar49._6_2_ - auVar90._6_2_;
    auVar120._8_2_ = auVar49._8_2_ - auVar90._8_2_;
    auVar120._10_2_ = auVar49._10_2_ - auVar90._10_2_;
    auVar120._12_2_ = auVar49._12_2_ - auVar90._12_2_;
    auVar120._14_2_ = auVar49._14_2_ - auVar90._14_2_;
    auVar50 = auVar50 ^ auVar121;
    auVar103._0_2_ = auVar50._0_2_ - auVar121._0_2_;
    auVar103._2_2_ = auVar50._2_2_ - auVar121._2_2_;
    auVar103._4_2_ = auVar50._4_2_ - auVar121._4_2_;
    auVar103._6_2_ = auVar50._6_2_ - auVar121._6_2_;
    auVar103._8_2_ = auVar50._8_2_ - auVar121._8_2_;
    auVar103._10_2_ = auVar50._10_2_ - auVar121._10_2_;
    auVar103._12_2_ = auVar50._12_2_ - auVar121._12_2_;
    auVar103._14_2_ = auVar50._14_2_ - auVar121._14_2_;
    auVar154 = auVar154 & auVar120;
    auVar137 = auVar137 & auVar103;
    auVar49 = psraw(auVar154,0xf);
    auVar92._0_12_ = auVar154._0_12_;
    auVar92._12_2_ = auVar154._6_2_;
    auVar92._14_2_ = auVar49._6_2_;
    auVar90._12_4_ = auVar92._12_4_;
    auVar90._0_10_ = auVar154._0_10_;
    auVar90._10_2_ = auVar49._4_2_;
    auVar121._10_6_ = auVar90._10_6_;
    auVar121._0_8_ = auVar154._0_8_;
    auVar121._8_2_ = auVar154._4_2_;
    auVar91._8_8_ = auVar121._8_8_;
    auVar91._6_2_ = auVar49._2_2_;
    auVar91._4_2_ = auVar154._2_2_;
    auVar91._0_2_ = auVar154._0_2_;
    auVar91._2_2_ = auVar49._0_2_;
    *(undefined1 (*) [16])qcoeff_ptr = auVar91;
    *(short *)(qcoeff_ptr + 4) = auVar154._8_2_;
    *(short *)((long)qcoeff_ptr + 0x12) = auVar49._8_2_;
    *(short *)(qcoeff_ptr + 5) = auVar154._10_2_;
    *(short *)((long)qcoeff_ptr + 0x16) = auVar49._10_2_;
    *(short *)(qcoeff_ptr + 6) = auVar154._12_2_;
    *(short *)((long)qcoeff_ptr + 0x1a) = auVar49._12_2_;
    *(short *)(qcoeff_ptr + 7) = auVar154._14_2_;
    *(short *)((long)qcoeff_ptr + 0x1e) = auVar49._14_2_;
    auVar49 = psraw(auVar137,0xf);
    auVar96._0_12_ = auVar137._0_12_;
    auVar96._12_2_ = auVar137._6_2_;
    auVar96._14_2_ = auVar49._6_2_;
    auVar95._12_4_ = auVar96._12_4_;
    auVar95._0_10_ = auVar137._0_10_;
    auVar95._10_2_ = auVar49._4_2_;
    auVar94._10_6_ = auVar95._10_6_;
    auVar94._0_8_ = auVar137._0_8_;
    auVar94._8_2_ = auVar137._4_2_;
    auVar93._8_8_ = auVar94._8_8_;
    auVar93._6_2_ = auVar49._2_2_;
    auVar93._4_2_ = auVar137._2_2_;
    auVar93._0_2_ = auVar137._0_2_;
    auVar93._2_2_ = auVar49._0_2_;
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = auVar93;
    *(short *)(qcoeff_ptr + 0xc) = auVar137._8_2_;
    *(short *)((long)qcoeff_ptr + 0x32) = auVar49._8_2_;
    *(short *)(qcoeff_ptr + 0xd) = auVar137._10_2_;
    *(short *)((long)qcoeff_ptr + 0x36) = auVar49._10_2_;
    *(short *)(qcoeff_ptr + 0xe) = auVar137._12_2_;
    *(short *)((long)qcoeff_ptr + 0x3a) = auVar49._12_2_;
    *(short *)(qcoeff_ptr + 0xf) = auVar137._14_2_;
    *(short *)((long)qcoeff_ptr + 0x3e) = auVar49._14_2_;
    sVar150 = auVar91._0_2_ * auVar136._0_2_;
    sVar157 = auVar154._2_2_ * auVar136._2_2_;
    uVar151 = CONCAT22(sVar157,sVar150);
    sVar158 = auVar154._4_2_ * auVar136._4_2_;
    uVar152 = CONCAT24(sVar158,uVar151);
    sVar159 = auVar154._6_2_ * auVar136._6_2_;
    uVar127 = CONCAT26(sVar159,uVar152);
    sVar160 = auVar154._8_2_ * sVar169;
    auVar153._0_10_ = CONCAT28(sVar160,uVar127);
    auVar153._10_2_ = auVar154._10_2_ * sVar43;
    auVar155._12_2_ = auVar154._12_2_ * sVar48;
    auVar155._0_12_ = auVar153;
    auVar155._14_2_ = auVar154._14_2_ * sVar173;
    sVar140 = auVar137._2_2_ * sVar43;
    uVar133 = CONCAT22(sVar140,auVar93._0_2_ * sVar169);
    sVar141 = auVar137._4_2_ * sVar48;
    uVar134 = CONCAT24(sVar141,uVar133);
    sVar142 = auVar137._6_2_ * sVar173;
    uVar51 = CONCAT26(sVar142,uVar134);
    sVar143 = auVar137._8_2_ * sVar169;
    auVar135._0_10_ = CONCAT28(sVar143,uVar51);
    auVar135._10_2_ = auVar137._10_2_ * sVar43;
    auVar138._12_2_ = auVar137._12_2_ * sVar48;
    auVar138._0_12_ = auVar135;
    auVar138._14_2_ = auVar137._14_2_ * sVar173;
    auVar49 = psraw(auVar155,0xf);
    auVar109._12_2_ = sVar159;
    auVar109._0_12_ = auVar153;
    auVar109._14_2_ = auVar49._6_2_;
    auVar108._12_4_ = auVar109._12_4_;
    auVar108._10_2_ = auVar49._4_2_;
    auVar108._0_10_ = auVar153._0_10_;
    auVar107._10_6_ = auVar108._10_6_;
    auVar107._8_2_ = sVar158;
    auVar107._0_8_ = uVar127;
    auVar106._8_8_ = auVar107._8_8_;
    auVar106._6_2_ = auVar49._2_2_;
    auVar106._0_6_ = uVar152;
    auVar105._6_10_ = auVar106._6_10_;
    auVar105._4_2_ = sVar157;
    auVar105._0_4_ = uVar151;
    auVar104._4_12_ = auVar105._4_12_;
    auVar104._2_2_ = auVar49._0_2_;
    auVar104._0_2_ = sVar150;
    *(undefined1 (*) [16])dqcoeff_ptr = auVar104;
    *(short *)(dqcoeff_ptr + 4) = sVar160;
    *(short *)((long)dqcoeff_ptr + 0x12) = auVar49._8_2_;
    *(short *)(dqcoeff_ptr + 5) = auVar153._10_2_;
    *(short *)((long)dqcoeff_ptr + 0x16) = auVar49._10_2_;
    *(short *)(dqcoeff_ptr + 6) = auVar155._12_2_;
    *(short *)((long)dqcoeff_ptr + 0x1a) = auVar49._12_2_;
    *(short *)(dqcoeff_ptr + 7) = auVar155._14_2_;
    *(short *)((long)dqcoeff_ptr + 0x1e) = auVar49._14_2_;
    auVar49 = psraw(auVar138,0xf);
    auVar115._12_2_ = sVar142;
    auVar115._0_12_ = auVar135;
    auVar115._14_2_ = auVar49._6_2_;
    auVar114._12_4_ = auVar115._12_4_;
    auVar114._10_2_ = auVar49._4_2_;
    auVar114._0_10_ = auVar135._0_10_;
    auVar113._10_6_ = auVar114._10_6_;
    auVar113._8_2_ = sVar141;
    auVar113._0_8_ = uVar51;
    auVar112._8_8_ = auVar113._8_8_;
    auVar112._6_2_ = auVar49._2_2_;
    auVar112._0_6_ = uVar134;
    auVar111._6_10_ = auVar112._6_10_;
    auVar111._4_2_ = sVar140;
    auVar111._0_4_ = uVar133;
    auVar110._4_12_ = auVar111._4_12_;
    auVar110._2_2_ = auVar49._0_2_;
    auVar110._0_2_ = auVar93._0_2_ * sVar169;
    *(undefined1 (*) [16])(dqcoeff_ptr + 8) = auVar110;
    *(short *)(dqcoeff_ptr + 0xc) = sVar143;
    *(short *)((long)dqcoeff_ptr + 0x32) = auVar49._8_2_;
    *(short *)(dqcoeff_ptr + 0xd) = auVar135._10_2_;
    *(short *)((long)dqcoeff_ptr + 0x36) = auVar49._10_2_;
    *(short *)(dqcoeff_ptr + 0xe) = auVar138._12_2_;
    *(short *)((long)dqcoeff_ptr + 0x3a) = auVar49._12_2_;
    *(short *)(dqcoeff_ptr + 0xf) = auVar138._14_2_;
    *(short *)((long)dqcoeff_ptr + 0x3e) = auVar49._14_2_;
  }
  uVar58 = (-1 < (short)uVar58) * uVar58;
  uVar82 = (-1 < (short)uVar82) * uVar82;
  uVar83 = (-1 < (short)uVar83) * uVar83;
  uVar84 = (-1 < (short)uVar84) * uVar84;
  uVar85 = (-1 < (short)uVar85) * uVar85;
  uVar86 = (-1 < (short)uVar86) * uVar86;
  uVar87 = (-1 < (short)uVar87) * uVar87;
  uVar88 = (-1 < (short)uVar88) * uVar88;
  uVar130 = (-1 < (short)uVar130) * uVar130;
  uVar129 = (-1 < (short)uVar129) * uVar129;
  uVar126 = (-1 < (short)uVar126) * uVar126;
  uVar119 = (-1 < (short)uVar119) * uVar119;
  uVar118 = (-1 < (short)uVar118) * uVar118;
  uVar117 = (-1 < (short)uVar117) * uVar117;
  uVar116 = (-1 < (short)uVar116) * uVar116;
  uVar100 = (-1 < (short)uVar100) * uVar100;
  if (0x10 < n_coeffs) {
    lVar35 = 0x10;
    do {
      auVar49 = packssdw(*(undefined1 (*) [16])(coeff_ptr + lVar35),
                         *(undefined1 (*) [16])(coeff_ptr + lVar35 + 4));
      auVar50 = packssdw(*(undefined1 (*) [16])(coeff_ptr + lVar35 + 8),
                         *(undefined1 (*) [16])(coeff_ptr + lVar35 + 0xc));
      sVar160 = auVar49._0_2_;
      sVar140 = -sVar160;
      sVar97 = auVar49._2_2_;
      sVar141 = -sVar97;
      sVar98 = auVar49._4_2_;
      sVar142 = -sVar98;
      sVar99 = auVar49._6_2_;
      sVar143 = -sVar99;
      sVar122 = auVar49._8_2_;
      sVar150 = -sVar122;
      sVar123 = auVar49._10_2_;
      sVar157 = -sVar123;
      sVar124 = auVar49._12_2_;
      sVar158 = -sVar124;
      sVar125 = auVar49._14_2_;
      sVar159 = -sVar125;
      uVar131 = (ushort)(sVar140 < sVar160) * sVar160 | (ushort)(sVar140 >= sVar160) * sVar140;
      uVar132 = (ushort)(sVar141 < sVar97) * sVar97 | (ushort)(sVar141 >= sVar97) * sVar141;
      uVar55 = (ushort)(sVar142 < sVar98) * sVar98 | (ushort)(sVar142 >= sVar98) * sVar142;
      uVar56 = (ushort)(sVar143 < sVar99) * sVar99 | (ushort)(sVar143 >= sVar99) * sVar143;
      uVar51 = CONCAT26(uVar56,CONCAT24(uVar55,CONCAT22(uVar132,uVar131)));
      uVar57 = (ushort)(sVar150 < sVar122) * sVar122 | (ushort)(sVar150 >= sVar122) * sVar150;
      auVar52._0_10_ = CONCAT28(uVar57,uVar51);
      auVar52._10_2_ =
           (ushort)(sVar157 < sVar123) * sVar123 | (ushort)(sVar157 >= sVar123) * sVar157;
      auVar52._12_2_ =
           (ushort)(sVar158 < sVar124) * sVar124 | (ushort)(sVar158 >= sVar124) * sVar158;
      auVar52._14_2_ =
           (ushort)(sVar159 < sVar125) * sVar125 | (ushort)(sVar159 >= sVar125) * sVar159;
      sVar160 = auVar50._0_2_;
      sVar140 = -sVar160;
      sVar97 = auVar50._2_2_;
      sVar141 = -sVar97;
      sVar98 = auVar50._4_2_;
      sVar142 = -sVar98;
      sVar99 = auVar50._6_2_;
      sVar143 = -sVar99;
      sVar122 = auVar50._8_2_;
      sVar150 = -sVar122;
      sVar123 = auVar50._10_2_;
      sVar157 = -sVar123;
      sVar124 = auVar50._12_2_;
      sVar158 = -sVar124;
      sVar125 = auVar50._14_2_;
      sVar159 = -sVar125;
      uVar144 = (ushort)(sVar140 < sVar160) * sVar160 | (ushort)(sVar140 >= sVar160) * sVar140;
      uVar146 = (ushort)(sVar141 < sVar97) * sVar97 | (ushort)(sVar141 >= sVar97) * sVar141;
      uVar147 = (ushort)(sVar142 < sVar98) * sVar98 | (ushort)(sVar142 >= sVar98) * sVar142;
      uVar148 = (ushort)(sVar143 < sVar99) * sVar99 | (ushort)(sVar143 >= sVar99) * sVar143;
      uVar127 = CONCAT26(uVar148,CONCAT24(uVar147,CONCAT22(uVar146,uVar144)));
      uVar149 = (ushort)(sVar150 < sVar122) * sVar122 | (ushort)(sVar150 >= sVar122) * sVar150;
      auVar145._0_10_ = CONCAT28(uVar149,uVar127);
      auVar145._10_2_ =
           (ushort)(sVar157 < sVar123) * sVar123 | (ushort)(sVar157 >= sVar123) * sVar157;
      auVar145._12_2_ =
           (ushort)(sVar158 < sVar124) * sVar124 | (ushort)(sVar158 >= sVar124) * sVar158;
      auVar145._14_2_ =
           (ushort)(sVar159 < sVar125) * sVar125 | (ushort)(sVar159 >= sVar125) * sVar159;
      auVar5._10_2_ = 0;
      auVar5._0_10_ = auVar52._0_10_;
      auVar5._12_2_ = uVar56;
      auVar9._8_2_ = uVar55;
      auVar9._0_8_ = uVar51;
      auVar9._10_4_ = auVar5._10_4_;
      auVar32._6_8_ = 0;
      auVar32._0_6_ = auVar9._8_6_;
      auVar13._4_2_ = uVar132;
      auVar13._0_4_ = CONCAT22(uVar132,uVar131);
      auVar13._6_8_ = SUB148(auVar32 << 0x40,6);
      auVar6._10_2_ = 0;
      auVar6._0_10_ = auVar145._0_10_;
      auVar6._12_2_ = uVar148;
      auVar10._8_2_ = uVar147;
      auVar10._0_8_ = uVar127;
      auVar10._10_4_ = auVar6._10_4_;
      auVar33._6_8_ = 0;
      auVar33._0_6_ = auVar10._8_6_;
      auVar14._4_2_ = uVar146;
      auVar14._0_4_ = CONCAT22(uVar146,uVar144);
      auVar14._6_8_ = SUB148(auVar33 << 0x40,6);
      auVar156._0_4_ = -(uint)(iVar42 < (int)((uint)uVar131 << 5));
      auVar156._4_4_ = -(uint)(iVar42 < auVar13._4_4_ << 5);
      auVar156._8_4_ = -(uint)(iVar42 < auVar9._8_4_ << 5);
      auVar156._12_4_ = -(uint)(iVar42 < (int)((auVar5._10_4_ >> 0x10) << 5));
      auVar139._0_4_ = -(uint)(iVar42 < (int)((uint)uVar57 << 5));
      auVar139._4_4_ = -(uint)(iVar42 < (int)((uint)auVar52._10_2_ << 5));
      auVar139._8_4_ = -(uint)(iVar42 < (int)((uint)auVar52._12_2_ << 5));
      auVar139._12_4_ = -(uint)(iVar42 < (int)((uint)auVar52._14_2_ << 5));
      auVar89 = packssdw(auVar156,auVar139);
      auVar163._0_4_ = -(uint)(iVar42 < (int)((uint)uVar144 << 5));
      auVar163._4_4_ = -(uint)(iVar42 < auVar14._4_4_ << 5);
      auVar163._8_4_ = -(uint)(iVar42 < auVar10._8_4_ << 5);
      auVar163._12_4_ = -(uint)(iVar42 < (int)((auVar6._10_4_ >> 0x10) << 5));
      auVar176._0_4_ = -(uint)(iVar42 < (int)((uint)uVar149 << 5));
      auVar176._4_4_ = -(uint)(iVar42 < (int)((uint)auVar145._10_2_ << 5));
      auVar176._8_4_ = -(uint)(iVar42 < (int)((uint)auVar145._12_2_ << 5));
      auVar176._12_4_ = -(uint)(iVar42 < (int)((uint)auVar145._14_2_ << 5));
      auVar101 = packssdw(auVar163,auVar176);
      auVar59 = auVar101 | auVar89;
      uVar161 = 0;
      uVar166 = 0;
      uVar167 = 0;
      uVar168 = 0;
      uVar170 = 0;
      uVar171 = 0;
      uVar172 = 0;
      uVar174 = 0;
      if ((((((((((((((((auVar59 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar59 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar59 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar59 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar59 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar59 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar59 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar59 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar59 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar59 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar59 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar59 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar59[0xf] < '\0'
         ) {
        auVar89 = auVar89 & *(undefined1 (*) [16])(iscan + lVar35);
        auVar101 = auVar101 & *(undefined1 (*) [16])(iscan + lVar35 + 8);
        sVar140 = auVar89._0_2_;
        sVar141 = auVar101._0_2_;
        uVar161 = (ushort)(sVar141 < sVar140) * sVar140 | (ushort)(sVar141 >= sVar140) * sVar141;
        sVar140 = auVar89._2_2_;
        sVar141 = auVar101._2_2_;
        uVar166 = (ushort)(sVar141 < sVar140) * sVar140 | (ushort)(sVar141 >= sVar140) * sVar141;
        sVar140 = auVar89._4_2_;
        sVar141 = auVar101._4_2_;
        uVar167 = (ushort)(sVar141 < sVar140) * sVar140 | (ushort)(sVar141 >= sVar140) * sVar141;
        sVar140 = auVar89._6_2_;
        sVar141 = auVar101._6_2_;
        uVar168 = (ushort)(sVar141 < sVar140) * sVar140 | (ushort)(sVar141 >= sVar140) * sVar141;
        sVar140 = auVar89._8_2_;
        sVar141 = auVar101._8_2_;
        uVar170 = (ushort)(sVar141 < sVar140) * sVar140 | (ushort)(sVar141 >= sVar140) * sVar141;
        sVar140 = auVar89._10_2_;
        sVar141 = auVar101._10_2_;
        uVar171 = (ushort)(sVar141 < sVar140) * sVar140 | (ushort)(sVar141 >= sVar140) * sVar141;
        sVar140 = auVar89._12_2_;
        sVar141 = auVar101._12_2_;
        sVar142 = auVar101._14_2_;
        uVar172 = (ushort)(sVar141 < sVar140) * sVar140 | (ushort)(sVar141 >= sVar140) * sVar141;
        sVar140 = auVar89._14_2_;
        uVar174 = (ushort)(sVar142 < sVar140) * sVar140 | (ushort)(sVar142 >= sVar140) * sVar142;
        bVar41 = true;
      }
      auVar164._0_2_ = -(ushort)(sVar44 < (short)uVar131);
      auVar164._2_2_ = -(ushort)(sVar45 < (short)uVar132);
      auVar164._4_2_ = -(ushort)(sVar46 < (short)uVar55);
      auVar164._6_2_ = -(ushort)(sVar47 < (short)uVar56);
      auVar164._8_2_ = -(ushort)(sVar44 < (short)uVar57);
      auVar164._10_2_ = -(ushort)(sVar45 < (short)auVar52._10_2_);
      auVar164._12_2_ = -(ushort)(sVar46 < (short)auVar52._12_2_);
      auVar164._14_2_ = -(ushort)(sVar47 < (short)auVar52._14_2_);
      auVar177._0_2_ = -(ushort)(sVar44 < (short)uVar144);
      auVar177._2_2_ = -(ushort)(sVar45 < (short)uVar146);
      auVar177._4_2_ = -(ushort)(sVar46 < (short)uVar147);
      auVar177._6_2_ = -(ushort)(sVar47 < (short)uVar148);
      auVar177._8_2_ = -(ushort)(sVar44 < (short)uVar149);
      auVar177._10_2_ = -(ushort)(sVar45 < (short)auVar145._10_2_);
      auVar177._12_2_ = -(ushort)(sVar46 < (short)auVar145._12_2_);
      auVar177._14_2_ = -(ushort)(sVar47 < (short)auVar145._14_2_);
      auVar59 = auVar177 | auVar164;
      if ((((((((((((((((auVar59 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar59 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar59 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar59 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar59 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar59 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar59 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar59 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar59 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar59 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar59 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar59 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar59 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar59 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar59 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar59[0xf])
      {
        uVar131 = 0;
        uVar132 = 0;
        uVar55 = 0;
        uVar56 = 0;
        uVar57 = 0;
        uVar144 = 0;
        uVar146 = 0;
        uVar147 = 0;
      }
      else {
        auVar89 = *(undefined1 (*) [16])(iscan + lVar35) & auVar164;
        auVar101 = *(undefined1 (*) [16])(iscan + lVar35 + 8) & auVar177;
        sVar140 = auVar89._0_2_;
        sVar141 = auVar101._0_2_;
        uVar131 = (ushort)(sVar141 < sVar140) * sVar140 | (ushort)(sVar141 >= sVar140) * sVar141;
        sVar140 = auVar89._2_2_;
        sVar141 = auVar101._2_2_;
        uVar132 = (ushort)(sVar141 < sVar140) * sVar140 | (ushort)(sVar141 >= sVar140) * sVar141;
        sVar140 = auVar89._4_2_;
        sVar141 = auVar101._4_2_;
        uVar55 = (ushort)(sVar141 < sVar140) * sVar140 | (ushort)(sVar141 >= sVar140) * sVar141;
        sVar140 = auVar89._6_2_;
        sVar141 = auVar101._6_2_;
        uVar56 = (ushort)(sVar141 < sVar140) * sVar140 | (ushort)(sVar141 >= sVar140) * sVar141;
        sVar140 = auVar89._8_2_;
        sVar141 = auVar101._8_2_;
        uVar57 = (ushort)(sVar141 < sVar140) * sVar140 | (ushort)(sVar141 >= sVar140) * sVar141;
        sVar140 = auVar89._10_2_;
        sVar141 = auVar101._10_2_;
        uVar144 = (ushort)(sVar141 < sVar140) * sVar140 | (ushort)(sVar141 >= sVar140) * sVar141;
        sVar140 = auVar89._12_2_;
        sVar141 = auVar101._12_2_;
        sVar142 = auVar101._14_2_;
        uVar146 = (ushort)(sVar141 < sVar140) * sVar140 | (ushort)(sVar141 >= sVar140) * sVar141;
        sVar140 = auVar89._14_2_;
        uVar147 = (ushort)(sVar142 < sVar140) * sVar140 | (ushort)(sVar142 >= sVar140) * sVar142;
        bVar3 = true;
      }
      if ((((((((((((((((auVar59 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar59 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar59 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar59 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar59 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar59 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar59 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar59 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar59 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar59 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar59 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar59 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar59 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar59 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar59 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar59[0xf])
      {
        *(undefined1 (*) [16])(qcoeff_ptr + lVar35 + 0xc) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar35 + 8) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar35 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar35) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar35 + 0xc) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar35 + 8) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar35 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar35) = (undefined1  [16])0x0;
      }
      else {
        auVar59 = psraw(auVar49,0xf);
        auVar89 = psraw(auVar50,0xf);
        auVar49 = paddsw(auVar52,local_48);
        auVar50 = pmulhw(auVar49,local_58);
        auVar60._0_2_ = auVar50._0_2_ + auVar49._0_2_;
        auVar60._2_2_ = auVar50._2_2_ + auVar49._2_2_;
        auVar60._4_2_ = auVar50._4_2_ + auVar49._4_2_;
        auVar60._6_2_ = auVar50._6_2_ + auVar49._6_2_;
        auVar60._8_2_ = auVar50._8_2_ + auVar49._8_2_;
        auVar60._10_2_ = auVar50._10_2_ + auVar49._10_2_;
        auVar60._12_2_ = auVar50._12_2_ + auVar49._12_2_;
        auVar60._14_2_ = auVar50._14_2_ + auVar49._14_2_;
        auVar50 = pmulhw(auVar60,local_68);
        auVar101 = paddsw(auVar145,local_48);
        auVar49 = pmulhw(auVar101,local_58);
        auVar53._0_2_ = auVar49._0_2_ + auVar101._0_2_;
        auVar53._2_2_ = auVar49._2_2_ + auVar101._2_2_;
        auVar53._4_2_ = auVar49._4_2_ + auVar101._4_2_;
        auVar53._6_2_ = auVar49._6_2_ + auVar101._6_2_;
        auVar53._8_2_ = auVar49._8_2_ + auVar101._8_2_;
        auVar53._10_2_ = auVar49._10_2_ + auVar101._10_2_;
        auVar53._12_2_ = auVar49._12_2_ + auVar101._12_2_;
        auVar53._14_2_ = auVar49._14_2_ + auVar101._14_2_;
        auVar49 = pmulhw(auVar53,local_68);
        auVar50 = auVar50 ^ auVar59;
        auVar61._0_2_ = auVar50._0_2_ - auVar59._0_2_;
        auVar61._2_2_ = auVar50._2_2_ - auVar59._2_2_;
        auVar61._4_2_ = auVar50._4_2_ - auVar59._4_2_;
        auVar61._6_2_ = auVar50._6_2_ - auVar59._6_2_;
        auVar61._8_2_ = auVar50._8_2_ - auVar59._8_2_;
        auVar61._10_2_ = auVar50._10_2_ - auVar59._10_2_;
        auVar61._12_2_ = auVar50._12_2_ - auVar59._12_2_;
        auVar61._14_2_ = auVar50._14_2_ - auVar59._14_2_;
        auVar49 = auVar49 ^ auVar89;
        auVar54._0_2_ = auVar49._0_2_ - auVar89._0_2_;
        auVar54._2_2_ = auVar49._2_2_ - auVar89._2_2_;
        auVar54._4_2_ = auVar49._4_2_ - auVar89._4_2_;
        auVar54._6_2_ = auVar49._6_2_ - auVar89._6_2_;
        auVar54._8_2_ = auVar49._8_2_ - auVar89._8_2_;
        auVar54._10_2_ = auVar49._10_2_ - auVar89._10_2_;
        auVar54._12_2_ = auVar49._12_2_ - auVar89._12_2_;
        auVar54._14_2_ = auVar49._14_2_ - auVar89._14_2_;
        auVar164 = auVar164 & auVar61;
        auVar177 = auVar177 & auVar54;
        auVar49 = psraw(auVar164,0xf);
        auVar65._0_12_ = auVar164._0_12_;
        auVar65._12_2_ = auVar164._6_2_;
        auVar65._14_2_ = auVar49._6_2_;
        auVar64._12_4_ = auVar65._12_4_;
        auVar64._0_10_ = auVar164._0_10_;
        auVar64._10_2_ = auVar49._4_2_;
        auVar63._10_6_ = auVar64._10_6_;
        auVar63._0_8_ = auVar164._0_8_;
        auVar63._8_2_ = auVar164._4_2_;
        auVar62._8_8_ = auVar63._8_8_;
        auVar62._6_2_ = auVar49._2_2_;
        auVar62._4_2_ = auVar164._2_2_;
        auVar62._0_2_ = auVar164._0_2_;
        auVar62._2_2_ = auVar49._0_2_;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar35) = auVar62;
        ptVar1 = qcoeff_ptr + lVar35 + 4;
        *(short *)ptVar1 = auVar164._8_2_;
        *(short *)((long)ptVar1 + 2) = auVar49._8_2_;
        *(short *)(ptVar1 + 1) = auVar164._10_2_;
        *(short *)((long)ptVar1 + 6) = auVar49._10_2_;
        *(short *)(ptVar1 + 2) = auVar164._12_2_;
        *(short *)((long)ptVar1 + 10) = auVar49._12_2_;
        *(short *)(ptVar1 + 3) = auVar164._14_2_;
        *(short *)((long)ptVar1 + 0xe) = auVar49._14_2_;
        auVar49 = psraw(auVar177,0xf);
        auVar69._0_12_ = auVar177._0_12_;
        auVar69._12_2_ = auVar177._6_2_;
        auVar69._14_2_ = auVar49._6_2_;
        auVar68._12_4_ = auVar69._12_4_;
        auVar68._0_10_ = auVar177._0_10_;
        auVar68._10_2_ = auVar49._4_2_;
        auVar67._10_6_ = auVar68._10_6_;
        auVar67._0_8_ = auVar177._0_8_;
        auVar67._8_2_ = auVar177._4_2_;
        auVar66._8_8_ = auVar67._8_8_;
        auVar66._6_2_ = auVar49._2_2_;
        auVar66._4_2_ = auVar177._2_2_;
        auVar66._0_2_ = auVar177._0_2_;
        auVar66._2_2_ = auVar49._0_2_;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar35 + 8) = auVar66;
        ptVar1 = qcoeff_ptr + lVar35 + 0xc;
        *(short *)ptVar1 = auVar177._8_2_;
        *(short *)((long)ptVar1 + 2) = auVar49._8_2_;
        *(short *)(ptVar1 + 1) = auVar177._10_2_;
        *(short *)((long)ptVar1 + 6) = auVar49._10_2_;
        *(short *)(ptVar1 + 2) = auVar177._12_2_;
        *(short *)((long)ptVar1 + 10) = auVar49._12_2_;
        *(short *)(ptVar1 + 3) = auVar177._14_2_;
        *(short *)((long)ptVar1 + 0xe) = auVar49._14_2_;
        sVar140 = auVar164._2_2_ * sVar43;
        uVar133 = CONCAT22(sVar140,auVar62._0_2_ * sVar169);
        sVar141 = auVar164._4_2_ * sVar48;
        uVar134 = CONCAT24(sVar141,uVar133);
        sVar142 = auVar164._6_2_ * sVar173;
        uVar51 = CONCAT26(sVar142,uVar134);
        sVar143 = auVar164._8_2_ * sVar169;
        auVar162._0_10_ = CONCAT28(sVar143,uVar51);
        auVar162._10_2_ = auVar164._10_2_ * sVar43;
        auVar165._12_2_ = auVar164._12_2_ * sVar48;
        auVar165._0_12_ = auVar162;
        auVar165._14_2_ = auVar164._14_2_ * sVar173;
        sVar150 = auVar177._2_2_ * sVar43;
        uVar151 = CONCAT22(sVar150,auVar66._0_2_ * sVar169);
        sVar157 = auVar177._4_2_ * sVar48;
        uVar152 = CONCAT24(sVar157,uVar151);
        sVar158 = auVar177._6_2_ * sVar173;
        uVar127 = CONCAT26(sVar158,uVar152);
        sVar159 = auVar177._8_2_ * sVar169;
        auVar175._0_10_ = CONCAT28(sVar159,uVar127);
        auVar175._10_2_ = auVar177._10_2_ * sVar43;
        auVar178._12_2_ = auVar177._12_2_ * sVar48;
        auVar178._0_12_ = auVar175;
        auVar178._14_2_ = auVar177._14_2_ * sVar173;
        auVar49 = psraw(auVar165,0xf);
        auVar75._12_2_ = sVar142;
        auVar75._0_12_ = auVar162;
        auVar75._14_2_ = auVar49._6_2_;
        auVar74._12_4_ = auVar75._12_4_;
        auVar74._10_2_ = auVar49._4_2_;
        auVar74._0_10_ = auVar162._0_10_;
        auVar73._10_6_ = auVar74._10_6_;
        auVar73._8_2_ = sVar141;
        auVar73._0_8_ = uVar51;
        auVar72._8_8_ = auVar73._8_8_;
        auVar72._6_2_ = auVar49._2_2_;
        auVar72._0_6_ = uVar134;
        auVar71._6_10_ = auVar72._6_10_;
        auVar71._4_2_ = sVar140;
        auVar71._0_4_ = uVar133;
        auVar70._4_12_ = auVar71._4_12_;
        auVar70._2_2_ = auVar49._0_2_;
        auVar70._0_2_ = auVar62._0_2_ * sVar169;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar35) = auVar70;
        ptVar1 = dqcoeff_ptr + lVar35 + 4;
        *(short *)ptVar1 = sVar143;
        *(short *)((long)ptVar1 + 2) = auVar49._8_2_;
        *(short *)(ptVar1 + 1) = auVar162._10_2_;
        *(short *)((long)ptVar1 + 6) = auVar49._10_2_;
        *(short *)(ptVar1 + 2) = auVar165._12_2_;
        *(short *)((long)ptVar1 + 10) = auVar49._12_2_;
        *(short *)(ptVar1 + 3) = auVar165._14_2_;
        *(short *)((long)ptVar1 + 0xe) = auVar49._14_2_;
        auVar49 = psraw(auVar178,0xf);
        auVar81._12_2_ = sVar158;
        auVar81._0_12_ = auVar175;
        auVar81._14_2_ = auVar49._6_2_;
        auVar80._12_4_ = auVar81._12_4_;
        auVar80._10_2_ = auVar49._4_2_;
        auVar80._0_10_ = auVar175._0_10_;
        auVar79._10_6_ = auVar80._10_6_;
        auVar79._8_2_ = sVar157;
        auVar79._0_8_ = uVar127;
        auVar78._8_8_ = auVar79._8_8_;
        auVar78._6_2_ = auVar49._2_2_;
        auVar78._0_6_ = uVar152;
        auVar77._6_10_ = auVar78._6_10_;
        auVar77._4_2_ = sVar150;
        auVar77._0_4_ = uVar151;
        auVar76._4_12_ = auVar77._4_12_;
        auVar76._2_2_ = auVar49._0_2_;
        auVar76._0_2_ = auVar66._0_2_ * sVar169;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar35 + 8) = auVar76;
        ptVar1 = dqcoeff_ptr + lVar35 + 0xc;
        *(short *)ptVar1 = sVar159;
        *(short *)((long)ptVar1 + 2) = auVar49._8_2_;
        *(short *)(ptVar1 + 1) = auVar175._10_2_;
        *(short *)((long)ptVar1 + 6) = auVar49._10_2_;
        *(short *)(ptVar1 + 2) = auVar178._12_2_;
        *(short *)((long)ptVar1 + 10) = auVar49._12_2_;
        *(short *)(ptVar1 + 3) = auVar178._14_2_;
        *(short *)((long)ptVar1 + 0xe) = auVar49._14_2_;
      }
      uVar58 = ((short)uVar58 < (short)uVar161) * uVar161 |
               ((short)uVar58 >= (short)uVar161) * uVar58;
      uVar82 = ((short)uVar82 < (short)uVar166) * uVar166 |
               ((short)uVar82 >= (short)uVar166) * uVar82;
      uVar83 = ((short)uVar83 < (short)uVar167) * uVar167 |
               ((short)uVar83 >= (short)uVar167) * uVar83;
      uVar84 = ((short)uVar84 < (short)uVar168) * uVar168 |
               ((short)uVar84 >= (short)uVar168) * uVar84;
      uVar85 = ((short)uVar85 < (short)uVar170) * uVar170 |
               ((short)uVar85 >= (short)uVar170) * uVar85;
      uVar86 = ((short)uVar86 < (short)uVar171) * uVar171 |
               ((short)uVar86 >= (short)uVar171) * uVar86;
      uVar87 = ((short)uVar87 < (short)uVar172) * uVar172 |
               ((short)uVar87 >= (short)uVar172) * uVar87;
      uVar88 = ((short)uVar88 < (short)uVar174) * uVar174 |
               ((short)uVar88 >= (short)uVar174) * uVar88;
      uVar130 = ((short)uVar130 < (short)uVar131) * uVar131 |
                ((short)uVar130 >= (short)uVar131) * uVar130;
      uVar129 = ((short)uVar129 < (short)uVar132) * uVar132 |
                ((short)uVar129 >= (short)uVar132) * uVar129;
      uVar126 = ((short)uVar126 < (short)uVar55) * uVar55 |
                ((short)uVar126 >= (short)uVar55) * uVar126;
      uVar119 = ((short)uVar119 < (short)uVar56) * uVar56 |
                ((short)uVar119 >= (short)uVar56) * uVar119;
      uVar118 = ((short)uVar118 < (short)uVar57) * uVar57 |
                ((short)uVar118 >= (short)uVar57) * uVar118;
      uVar117 = ((short)uVar117 < (short)uVar144) * uVar144 |
                ((short)uVar117 >= (short)uVar144) * uVar117;
      uVar116 = ((short)uVar116 < (short)uVar146) * uVar146 |
                ((short)uVar116 >= (short)uVar146) * uVar116;
      uVar100 = ((short)uVar100 < (short)uVar147) * uVar147 |
                ((short)uVar100 >= (short)uVar147) * uVar100;
      lVar35 = lVar35 + 0x10;
    } while (lVar35 < n_coeffs);
  }
  if (bVar41) {
    uVar85 = ((short)uVar85 < (short)uVar58) * uVar58 | ((short)uVar85 >= (short)uVar58) * uVar85;
    uVar82 = ((short)uVar86 < (short)uVar82) * uVar82 | ((short)uVar86 >= (short)uVar82) * uVar86;
    uVar83 = ((short)uVar87 < (short)uVar83) * uVar83 | ((short)uVar87 >= (short)uVar83) * uVar87;
    uVar84 = ((short)uVar88 < (short)uVar84) * uVar84 | ((short)uVar88 >= (short)uVar84) * uVar88;
    uVar83 = ((short)uVar83 < (short)uVar85) * uVar85 | ((short)uVar83 >= (short)uVar85) * uVar83;
    uVar82 = ((short)uVar84 < (short)uVar82) * uVar82 | ((short)uVar84 >= (short)uVar82) * uVar84;
    uVar36 = (ushort)(((short)uVar82 < (short)uVar83) * uVar83 |
                     ((short)uVar82 >= (short)uVar83) * uVar82) + 1;
  }
  else {
    uVar36 = 0;
  }
  if (bVar3) {
    uVar82 = ((short)uVar118 < (short)uVar130) * uVar130 |
             ((short)uVar118 >= (short)uVar130) * uVar118;
    uVar83 = ((short)uVar117 < (short)uVar129) * uVar129 |
             ((short)uVar117 >= (short)uVar129) * uVar117;
    uVar84 = ((short)uVar116 < (short)uVar126) * uVar126 |
             ((short)uVar116 >= (short)uVar126) * uVar116;
    uVar85 = ((short)uVar100 < (short)uVar119) * uVar119 |
             ((short)uVar100 >= (short)uVar119) * uVar100;
    uVar82 = ((short)uVar84 < (short)uVar82) * uVar82 | ((short)uVar84 >= (short)uVar82) * uVar84;
    uVar83 = ((short)uVar85 < (short)uVar83) * uVar83 | ((short)uVar85 >= (short)uVar83) * uVar85;
    uVar34 = (uint)(ushort)(((short)uVar83 < (short)uVar82) * uVar82 |
                           ((short)uVar83 >= (short)uVar82) * uVar83);
  }
  else {
    uVar34 = 0xffffffff;
  }
  if ((int)uVar36 <= (int)uVar34) {
    iVar42 = uVar34 + 1;
    psVar38 = scan + uVar34;
    do {
      sVar169 = *psVar38;
      qcoeff_ptr[sVar169] = 0;
      dqcoeff_ptr[sVar169] = 0;
      iVar42 = iVar42 + -1;
      psVar38 = psVar38 + -1;
    } while ((int)uVar36 < iVar42);
  }
  uVar39 = 0xffffffff;
  uVar40 = (ulong)uVar36;
  do {
    iVar42 = (int)uVar39;
    if ((long)uVar40 < 1) break;
    lVar35 = uVar40 - 1;
    uVar40 = uVar40 - 1;
    if (qcoeff_ptr[scan[lVar35]] != 0) {
      uVar39 = uVar40 & 0xffffffff;
    }
    iVar42 = (int)uVar39;
  } while (qcoeff_ptr[scan[lVar35]] == 0);
  uVar37 = (uint16_t)(iVar42 + 1U);
  *eob_ptr = uVar37;
  if (uVar36 == 0) {
    uVar34 = 0xffffffff;
  }
  else {
    lVar35 = 0;
    do {
      uVar34 = (uint)lVar35;
      if (qcoeff_ptr[scan[lVar35]] != 0) break;
      bVar41 = (ulong)uVar36 - 1 != lVar35;
      lVar35 = lVar35 + 1;
      uVar34 = 0xffffffff;
    } while (bVar41);
  }
  if ((uVar37 != 0) && (uVar36 = (iVar42 + 1U & 0xffff) - 1, uVar34 == uVar36)) {
    sVar169 = scan[uVar36];
    if (((qcoeff_ptr[sVar169] == 1) || (qcoeff_ptr[sVar169] == -1)) &&
       (uVar36 = coeff_ptr[sVar169] >> 0x1f, uVar40 = (ulong)((uint)(sVar169 != 0) * 2),
       (int)((coeff_ptr[sVar169] << 5 ^ uVar36) - uVar36) <
       *(short *)((long)zbin_ptr + uVar40) * 0x20 +
       (*(short *)((long)dequant_ptr + uVar40) * 0x20d + 0x40 >> 7))) {
      qcoeff_ptr[sVar169] = 0;
      dqcoeff_ptr[sVar169] = 0;
      *eob_ptr = 0;
    }
  }
  return;
}

Assistant:

void aom_quantize_b_adaptive_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m128i zero = _mm_setzero_si128();
  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1;
  __m128i all_zero;
  __m128i mask0 = zero, mask1 = zero;

  int prescan_add[2];
  int thresh[4];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbin_ptr[i] * wt + prescan_add[i]) - 1;
  }
  thresh[2] = thresh[3] = thresh[1];
  __m128i threshold[2];
  threshold[0] = _mm_loadu_si128((__m128i *)&thresh[0]);
  threshold[1] = _mm_unpackhi_epi64(threshold[0], threshold[0]);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif
  // Setup global values.
  load_b_values(zbin_ptr, &zbin, round_ptr, &round, quant_ptr, &quant,
                dequant_ptr, &dequant, quant_shift_ptr, &shift);

  // Do DC and first 15 AC.
  coeff0 = load_coefficients(coeff_ptr);
  coeff1 = load_coefficients(coeff_ptr + 8);

  // Poor man's abs().
  coeff0_sign = _mm_srai_epi16(coeff0, 15);
  coeff1_sign = _mm_srai_epi16(coeff1, 15);
  qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

  update_mask0(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0, &mask0);

  cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

  update_mask1(&cmp_mask0, &cmp_mask1, iscan, &is_found1, &mask1);

  threshold[0] = threshold[1];
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 12), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 12), zero);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff(&qcoeff0, round, quant, shift);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);

    calculate_qcoeff(&qcoeff1, round, quant, shift);

    // Reinsert signs
    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr);
    store_coefficients(qcoeff1, qcoeff_ptr + 8);

    coeff0 = calculate_dqcoeff(qcoeff0, dequant);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    coeff1 = calculate_dqcoeff(qcoeff1, dequant);

    store_coefficients(coeff0, dqcoeff_ptr);
    store_coefficients(coeff1, dqcoeff_ptr + 8);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = load_coefficients(coeff_ptr + index);
    coeff1 = load_coefficients(coeff_ptr + index + 8);

    coeff0_sign = _mm_srai_epi16(coeff0, 15);
    coeff1_sign = _mm_srai_epi16(coeff1, 15);
    qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

    update_mask0(&qcoeff0, &qcoeff1, threshold, iscan + index, &is_found0,
                 &mask0);

    cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

    update_mask1(&cmp_mask0, &cmp_mask1, iscan + index, &is_found1, &mask1);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 12), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 12), zero);
      index += 16;
      continue;
    }
    calculate_qcoeff(&qcoeff0, round, quant, shift);
    calculate_qcoeff(&qcoeff1, round, quant, shift);

    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr + index);
    store_coefficients(qcoeff1, qcoeff_ptr + index + 8);

    coeff0 = calculate_dqcoeff(qcoeff0, dequant);
    coeff1 = calculate_dqcoeff(qcoeff1, dequant);

    store_coefficients(coeff0, dqcoeff_ptr + index);
    store_coefficients(coeff1, dqcoeff_ptr + index + 8);

    index += 16;
  }
  if (is_found0) non_zero_count = calculate_non_zero_count(mask0);
  if (is_found1)
    non_zero_count_prescan_add_zero = calculate_non_zero_count(mask1);

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff <
          (zbin_ptr[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}